

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::clara::TextFlow::Column::iterator::calcLength(iterator *this)

{
  char cVar1;
  Column *pCVar2;
  ulong uVar3;
  pointer pbVar4;
  size_t sVar5;
  long lVar6;
  void *pvVar7;
  bool bVar8;
  void *pvVar9;
  size_t sVar10;
  ulong uVar11;
  size_t sVar12;
  size_t sVar13;
  
  pCVar2 = this->m_column;
  uVar3 = this->m_stringIndex;
  pbVar4 = (pCVar2->m_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(pCVar2->m_strings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5) <= uVar3) {
    __assert_fail("m_stringIndex < m_column.m_strings.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Toxe[P]catch2-examples/src/single_header/multiple_test_files/include/catch2/catch.hpp"
                  ,0x2149,"void Catch::clara::TextFlow::Column::iterator::calcLength()");
  }
  this->m_suffix = false;
  sVar5 = this->m_pos;
  if ((sVar5 != 0 || uVar3 != 0) || (sVar12 = pCVar2->m_initialIndent, sVar12 == 0xffffffffffffffff)
     ) {
    sVar12 = pCVar2->m_indent;
  }
  sVar13 = pCVar2->m_width;
  this->m_end = sVar5;
  lVar6 = *(long *)&pbVar4[uVar3]._M_dataplus;
  sVar10 = sVar5;
  if (*(char *)(lVar6 + sVar5) == '\n') {
    sVar10 = sVar5 + 1;
    this->m_end = sVar10;
  }
  sVar13 = sVar13 - sVar12;
  uVar3 = *(size_type *)((long)(pbVar4 + uVar3) + 8);
  uVar11 = sVar10;
  if (sVar10 < uVar3) {
    do {
      uVar11 = sVar10;
      if (*(char *)(lVar6 + sVar10) == '\n') break;
      sVar10 = sVar10 + 1;
      this->m_end = sVar10;
      uVar11 = uVar3;
    } while (uVar3 != sVar10);
  }
  sVar12 = sVar13;
  if (uVar11 < sVar13 + sVar5) {
    sVar12 = uVar11 - sVar5;
    goto LAB_0013dfac;
  }
  for (; sVar12 != 0; sVar12 = sVar12 - 1) {
    bVar8 = isBoundary(this,this->m_pos + sVar12);
    if (bVar8) goto LAB_0013dfe6;
  }
  goto LAB_0013dfa2;
  while (sVar12 = sVar12 - 1, sVar12 != 0) {
LAB_0013dfe6:
    cVar1 = *(char *)((sVar12 - 1) +
                     *(long *)&(this->m_column->m_strings).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[this->m_stringIndex].
                               _M_dataplus + this->m_pos);
    if (isWhitespace(char)::chars_abi_cxx11_ == '\0') {
      calcLength();
    }
    pvVar7 = isWhitespace(char)::chars_abi_cxx11_;
    if (((DAT_00184d08 == 0) ||
        (pvVar9 = memchr(isWhitespace(char)::chars_abi_cxx11_,(int)cVar1,DAT_00184d08),
        pvVar9 == (void *)0x0)) || ((long)pvVar9 - (long)pvVar7 == -1)) goto LAB_0013dfac;
  }
LAB_0013dfa2:
  this->m_suffix = true;
  sVar12 = sVar13 - 1;
LAB_0013dfac:
  this->m_len = sVar12;
  return;
}

Assistant:

void calcLength() {
			assert(m_stringIndex < m_column.m_strings.size());

			m_suffix = false;
			auto width = m_column.m_width - indent();
			m_end = m_pos;
			if (line()[m_pos] == '\n') {
				++m_end;
			}
			while (m_end < line().size() && line()[m_end] != '\n')
				++m_end;

			if (m_end < m_pos + width) {
				m_len = m_end - m_pos;
			} else {
				size_t len = width;
				while (len > 0 && !isBoundary(m_pos + len))
					--len;
				while (len > 0 && isWhitespace(line()[m_pos + len - 1]))
					--len;

				if (len > 0) {
					m_len = len;
				} else {
					m_suffix = true;
					m_len = width - 1;
				}
			}
		}